

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_arange.c
# Opt level: O2

int dwarf_get_arange_info_b
              (Dwarf_Arange arange,Dwarf_Unsigned *segment,Dwarf_Unsigned *segment_entry_size,
              Dwarf_Addr *start,Dwarf_Unsigned *length,Dwarf_Off *cu_die_offset,Dwarf_Error *error)

{
  Dwarf_Unsigned offset;
  Dwarf_Debug dbg;
  int iVar1;
  Dwarf_Unsigned headerlen;
  
  if (arange == (Dwarf_Arange)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x8b);
    iVar1 = 1;
  }
  else {
    if (segment != (Dwarf_Unsigned *)0x0) {
      *segment = arange->ar_segment_selector;
    }
    if (segment_entry_size != (Dwarf_Unsigned *)0x0) {
      *segment_entry_size = (ulong)arange->ar_segment_selector_size;
    }
    if (start != (Dwarf_Addr *)0x0) {
      *start = arange->ar_address;
    }
    if (length != (Dwarf_Unsigned *)0x0) {
      *length = arange->ar_length;
    }
    iVar1 = 0;
    if (cu_die_offset != (Dwarf_Off *)0x0) {
      offset = arange->ar_info_offset;
      dbg = arange->ar_dbg;
      headerlen = 0;
      if ((((dbg->de_debug_info).dss_data != (Dwarf_Small *)0x0) ||
          (iVar1 = _dwarf_load_debug_info(dbg,error), iVar1 == 0)) &&
         (iVar1 = _dwarf_length_of_cu_header(dbg,offset,1,&headerlen,error), iVar1 == 0)) {
        *cu_die_offset = offset + headerlen;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int
dwarf_get_arange_info_b(Dwarf_Arange arange,
    Dwarf_Unsigned*  segment,
    Dwarf_Unsigned*  segment_entry_size,
    Dwarf_Addr    * start,
    Dwarf_Unsigned* length,
    Dwarf_Off     * cu_die_offset,
    Dwarf_Error   * error)
{
    if (arange == NULL) {
        _dwarf_error(NULL, error, DW_DLE_ARANGE_NULL);
        return DW_DLV_ERROR;
    }

    if (segment != NULL) {
        *segment = arange->ar_segment_selector;
    }
    if (segment_entry_size != NULL) {
        *segment_entry_size = arange->ar_segment_selector_size;
    }
    if (start != NULL)
        *start = arange->ar_address;
    if (length != NULL)
        *length = arange->ar_length;
    if (cu_die_offset != NULL) {
        Dwarf_Debug dbg = arange->ar_dbg;
        Dwarf_Off offset = arange->ar_info_offset;
        Dwarf_Unsigned headerlen = 0;
        int cres = 0;

        /* This applies to debug_info only, not to debug_types. */
        if (!dbg->de_debug_info.dss_data) {
            int res = _dwarf_load_debug_info(dbg, error);
            if (res != DW_DLV_OK) {
                return res;
            }
        }
        cres = _dwarf_length_of_cu_header(dbg, offset,
            TRUE, &headerlen,error);
        if (cres != DW_DLV_OK) {
            return cres;
        }
        *cu_die_offset = offset + headerlen;

    }
    return DW_DLV_OK;
}